

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::walk
          (Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *this,
          Expression **root)

{
  Expression **ppEVar1;
  Task TVar2;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<wasm::LocalScanner, wasm::Visitor<wasm::LocalScanner>>::walk(Expression *&) [SubType = wasm::LocalScanner, VisitorType = wasm::Visitor<wasm::LocalScanner>]"
                 );
  }
  pushTask(this,PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::scan,root)
  ;
  while( true ) {
    if (((long)(this->stack).flexible.
               super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->stack).flexible.
               super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed == 0) {
      return;
    }
    TVar2 = popTask(this);
    ppEVar1 = TVar2.currp;
    this->replacep = ppEVar1;
    if (*ppEVar1 == (Expression *)0x0) break;
    (*TVar2.func)((LocalScanner *)this,ppEVar1);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x132,
                "void wasm::Walker<wasm::LocalScanner, wasm::Visitor<wasm::LocalScanner>>::walk(Expression *&) [SubType = wasm::LocalScanner, VisitorType = wasm::Visitor<wasm::LocalScanner>]"
               );
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }